

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O2

void json_start_object(json_session *session,char *name)

{
  if (session->empty == false) {
    abuf_puts(session->out,",");
    session->empty = true;
  }
  if (name != (char *)0x0) {
    abuf_appendf(session->out,"\"%s\": {",name);
    return;
  }
  abuf_puts(session->out,"{");
  return;
}

Assistant:

void
json_start_object(struct json_session *session, const char *name) {
  /* open new session */
  if (!session->empty) {
    abuf_puts(session->out, ",");
    session->empty = true;
  }

  if (name) {
    abuf_appendf(session->out, "\"%s\": {", name);
  }
  else {
    abuf_puts(session->out, "{");
  }
}